

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

void xmlFreeStreamComp(xmlStreamCompPtr comp)

{
  xmlStreamCompPtr comp_local;
  
  if (comp != (xmlStreamCompPtr)0x0) {
    if (comp->steps != (xmlStreamStepPtr)0x0) {
      (*xmlFree)(comp->steps);
    }
    if (comp->dict != (xmlDict *)0x0) {
      xmlDictFree(comp->dict);
    }
    (*xmlFree)(comp);
  }
  return;
}

Assistant:

static void
xmlFreeStreamComp(xmlStreamCompPtr comp) {
    if (comp != NULL) {
        if (comp->steps != NULL)
	    xmlFree(comp->steps);
	if (comp->dict != NULL)
	    xmlDictFree(comp->dict);
        xmlFree(comp);
    }
}